

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_rowcol_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined8 *puVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  ulong uVar5;
  __m256i alVar6;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  int iVar10;
  uint uVar11;
  parasail_result_t *ppVar12;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  ulong uVar13;
  undefined8 uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  __m256i *palVar21;
  uint uVar22;
  __m256i *__return_storage_ptr__;
  ulong uVar23;
  size_t sVar24;
  char *__format;
  long lVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  size_t size;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined8 in_stack_fffffffffffffd40;
  size_t sVar40;
  undefined4 in_stack_fffffffffffffd70;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  ulong local_1e0;
  ulong uStack_1d8;
  ulong uStack_1d0;
  ulong uStack_1c8;
  undefined1 local_1c0 [32];
  longlong local_a0 [4];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "profile";
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "profile->profile64.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar19 = "profile->matrix";
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar19 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "open";
        }
        else {
          if (-1 < gap) {
            uVar22 = uVar16 - 1;
            size = (ulong)uVar16 + 3 >> 2;
            uVar13 = uVar22 / size;
            uVar5 = (ulong)uVar22 % size;
            uVar28 = CONCAT44(0,open);
            iVar15 = -open;
            iVar29 = ppVar3->min;
            uVar23 = 0x8000000000000000 - (long)iVar29;
            if (iVar29 != iVar15 && SBORROW4(iVar29,iVar15) == iVar29 + open < 0) {
              uVar23 = uVar28 | 0x8000000000000000;
            }
            iVar29 = ppVar3->max;
            ppVar12 = parasail_result_new_rowcol1((uint)((ulong)uVar16 + 3) & 0x7ffffffc,s2Len);
            if (ppVar12 != (parasail_result_t *)0x0) {
              ppVar12->flag = ppVar12->flag | 0x4840401;
              ptr = parasail_memalign___m256i(0x20,size);
              __return_storage_ptr__ = (__m256i *)(ulong)(s2Len + 1);
              ptr_00 = parasail_memalign_int64_t(0x20,(size_t)__return_storage_ptr__);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              sVar40 = size;
              ptr_03 = parasail_memalign___m256i(0x20,size);
              if (ptr_03 != (__m256i *)0x0 &&
                  ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
                iVar10 = s2Len + -1;
                iVar27 = 3 - (int)uVar13;
                auVar32._8_4_ = open;
                auVar32._0_8_ = uVar28;
                auVar32._12_4_ = 0;
                auVar32._16_4_ = open;
                auVar32._20_4_ = 0;
                auVar32._24_4_ = open;
                auVar32._28_4_ = 0;
                uVar13 = CONCAT44(0,gap);
                auVar33._8_4_ = gap;
                auVar33._0_8_ = uVar13;
                auVar33._12_4_ = 0;
                auVar33._16_4_ = gap;
                auVar33._20_4_ = 0;
                auVar33._24_4_ = gap;
                auVar33._28_4_ = 0;
                uVar23 = uVar23 + 1;
                lVar20 = 0x7ffffffffffffffe - (long)iVar29;
                lVar17 = (long)-(gap * (int)size);
                auVar34._8_8_ = lVar17;
                auVar34._0_8_ = lVar17;
                auVar34._16_8_ = lVar17;
                auVar34._24_8_ = lVar17;
                auVar34 = vpblendd_avx2(auVar34,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
                auVar34 = vpaddq_avx2(ZEXT832(uVar23),auVar34);
                lVar18 = (long)iVar15;
                lVar17 = lVar18;
                for (sVar24 = 0; sVar24 != size; sVar24 = sVar24 + 1) {
                  lVar25 = lVar17;
                  for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
                    local_80[lVar26] = lVar25;
                    local_a0[lVar26] = lVar25 - uVar28;
                    lVar25 = lVar25 - size * uVar13;
                  }
                  palVar21 = ptr_02 + sVar24;
                  (*palVar21)[0] = local_80[0];
                  (*palVar21)[1] = local_80[1];
                  (*palVar21)[2] = local_80[2];
                  (*palVar21)[3] = local_80[3];
                  palVar21 = ptr + sVar24;
                  (*palVar21)[0] = local_a0[0];
                  (*palVar21)[1] = local_a0[1];
                  (*palVar21)[2] = local_a0[2];
                  (*palVar21)[3] = local_a0[3];
                  lVar17 = lVar17 - uVar13;
                }
                *ptr_00 = 0;
                for (palVar21 = (__m256i *)0x1; __return_storage_ptr__ != palVar21;
                    palVar21 = (__m256i *)((long)*palVar21 + 1)) {
                  ptr_00[(long)palVar21] = lVar18;
                  lVar18 = lVar18 - uVar13;
                }
                alVar6 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar32);
                uVar11 = (int)size - 1;
                for (uVar16 = uVar11; -1 < (int)uVar16; uVar16 = uVar16 - 1) {
                  ptr_03[uVar16] = alVar6;
                  alVar6 = (__m256i)vpsubq_avx2((undefined1  [32])alVar6,auVar33);
                }
                lVar17 = size << 5;
                local_1c0._8_8_ = lVar20;
                local_1c0._0_8_ = lVar20;
                local_1c0._16_8_ = lVar20;
                local_1c0._24_8_ = lVar20;
                uVar13 = 0;
                local_1e0 = uVar23;
                uStack_1d8 = uVar23;
                uStack_1d0 = uVar23;
                uStack_1c8 = uVar23;
                while (uVar13 != (uint)s2Len) {
                  alVar6 = ptr_02[uVar11];
                  auVar31 = alVar6._0_16_;
                  auVar39._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar31;
                  auVar39._16_16_ = ZEXT116(0) * alVar6._16_16_ + ZEXT116(1) * auVar31;
                  auVar39 = vpalignr_avx2((undefined1  [32])alVar6,auVar39,8);
                  auVar37 = vpblendd_avx2(auVar39,ZEXT832((ulong)ptr_00[uVar13]),3);
                  iVar29 = ppVar3->mapper[(byte)s2[uVar13]];
                  iVar15 = (int)size;
                  local_240._8_8_ = uVar23;
                  local_240._0_8_ = uVar23;
                  local_240._16_8_ = uVar23;
                  local_240._24_8_ = uVar23;
                  auVar39 = vpsubq_avx2(local_240,(undefined1  [32])*ptr_03);
                  size = sVar40;
                  for (lVar18 = 0; lVar17 != lVar18; lVar18 = lVar18 + 0x20) {
                    auVar36 = *(undefined1 (*) [32])((long)*ptr_02 + lVar18);
                    auVar35 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar18),auVar33);
                    vpsubq_avx2(auVar36,auVar32);
                    vpaddq_avx2(auVar37,*(undefined1 (*) [32])
                                         ((long)pvVar2 + lVar18 + (long)(iVar29 * iVar15) * 0x20));
                    alVar6[1] = (longlong)ptr_00;
                    alVar6[0] = in_stack_fffffffffffffd40;
                    alVar6[2] = size;
                    alVar6[3] = (longlong)ptr_03;
                    b[1] = (longlong)ptr_01;
                    b[0] = (longlong)ptr;
                    b[2]._0_4_ = in_stack_fffffffffffffd70;
                    b[2]._4_4_ = iVar10;
                    b[3]._0_4_ = uVar22;
                    b[3]._4_4_ = iVar27;
                    palVar21 = ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,alVar6,b);
                    vpaddq_avx2(auVar39,*(undefined1 (*) [32])((long)*ptr_03 + lVar18));
                    a[1] = (longlong)ptr_00;
                    a[0] = in_stack_fffffffffffffd40;
                    a[2] = size;
                    a[3] = (longlong)ptr_03;
                    b_00[1] = (longlong)ptr_01;
                    b_00[0] = (longlong)palVar21;
                    b_00[2]._0_4_ = in_stack_fffffffffffffd70;
                    b_00[2]._4_4_ = iVar10;
                    b_00[3]._0_4_ = uVar22;
                    b_00[3]._4_4_ = iVar27;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a,b_00);
                    a_00[1] = (longlong)ptr_00;
                    a_00[0] = in_stack_fffffffffffffd40;
                    a_00[2] = size;
                    a_00[3] = (longlong)ptr_03;
                    b_01[1] = (longlong)ptr_01;
                    b_01[0] = (longlong)palVar21;
                    b_01[2]._0_4_ = in_stack_fffffffffffffd70;
                    b_01[2]._4_4_ = iVar10;
                    b_01[3]._0_4_ = uVar22;
                    b_01[3]._4_4_ = iVar27;
                    auVar39 = auVar35;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_01);
                    local_260._0_8_ = auVar35._0_8_;
                    local_260._8_8_ = auVar35._8_8_;
                    local_260._16_8_ = auVar35._16_8_;
                    local_260._24_8_ = auVar35._24_8_;
                    puVar1 = (undefined8 *)((long)*ptr + lVar18);
                    *puVar1 = local_260._0_8_;
                    puVar1[1] = local_260._8_8_;
                    puVar1[2] = local_260._16_8_;
                    puVar1[3] = local_260._24_8_;
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar18) = auVar39;
                    auVar37 = auVar36;
                    ptr = palVar21;
                  }
                  auVar39 = vpermq_avx2(auVar39,0x90);
                  auVar39 = vpblendd_avx2(auVar39,ZEXT832((ulong)ptr_00[uVar13 + 1]),3);
                  vpaddq_avx2(auVar39,(undefined1  [32])*ptr_03);
                  auVar38 = ZEXT3264(local_240);
                  a_01[1] = (longlong)ptr_00;
                  a_01[0] = in_stack_fffffffffffffd40;
                  a_01[2] = size;
                  a_01[3] = (longlong)ptr_03;
                  b_02[1] = (longlong)ptr_01;
                  b_02[0] = (longlong)ptr;
                  b_02[2]._0_4_ = in_stack_fffffffffffffd70;
                  b_02[2]._4_4_ = iVar10;
                  b_02[3]._0_4_ = uVar22;
                  b_02[3]._4_4_ = iVar27;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_02);
                  iVar29 = 2;
                  while( true ) {
                    auVar36 = auVar38._0_32_;
                    auVar37 = vperm2i128_avx2(auVar36,auVar36,8);
                    auVar37 = vpalignr_avx2(auVar36,auVar37,8);
                    bVar30 = iVar29 == 0;
                    iVar29 = iVar29 + -1;
                    if (bVar30) break;
                    vpaddq_avx2(auVar37,auVar34);
                    a_02[1] = (longlong)ptr_00;
                    a_02[0] = in_stack_fffffffffffffd40;
                    a_02[2] = size;
                    a_02[3] = (longlong)ptr_03;
                    b_03[1] = (longlong)ptr_01;
                    b_03[0] = (longlong)ptr;
                    b_03[2]._0_4_ = in_stack_fffffffffffffd70;
                    b_03[2]._4_4_ = iVar10;
                    b_03[3]._0_4_ = uVar22;
                    b_03[3]._4_4_ = iVar27;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_02,b_03);
                  }
                  auVar37 = vpaddq_avx2(auVar37,ZEXT832(uVar23));
                  local_260._0_8_ = auVar39._0_8_;
                  local_260._8_8_ = auVar39._8_8_;
                  local_260._16_8_ = auVar39._16_8_;
                  local_260._24_8_ = auVar39._24_8_;
                  a_03[1] = (longlong)ptr_00;
                  a_03[0] = in_stack_fffffffffffffd40;
                  a_03[2] = size;
                  a_03[3] = (longlong)ptr_03;
                  b_04[1] = (longlong)ptr_01;
                  b_04[0] = (longlong)ptr;
                  b_04[2]._0_4_ = in_stack_fffffffffffffd70;
                  b_04[2]._4_4_ = iVar10;
                  b_04[3]._0_4_ = uVar22;
                  b_04[3]._4_4_ = iVar27;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_03,b_04);
                  local_240._8_8_ = local_260._8_8_;
                  local_240._0_8_ = local_260._0_8_;
                  local_240._16_8_ = local_260._16_8_;
                  local_240._24_8_ = local_260._24_8_;
                  local_260 = auVar37;
                  for (lVar18 = 0; lVar17 != lVar18; lVar18 = lVar18 + 0x20) {
                    auVar37 = *(undefined1 (*) [32])((long)*ptr_01 + lVar18);
                    local_260 = vpsubq_avx2(local_260,auVar33);
                    vpsubq_avx2(local_240,auVar32);
                    a_04[1] = (longlong)ptr_00;
                    a_04[0] = in_stack_fffffffffffffd40;
                    a_04[2] = size;
                    a_04[3] = (longlong)ptr_03;
                    b_05[1] = (longlong)ptr_01;
                    b_05[0] = (longlong)ptr;
                    b_05[2]._0_4_ = in_stack_fffffffffffffd70;
                    b_05[2]._4_4_ = iVar10;
                    b_05[3]._0_4_ = uVar22;
                    b_05[3]._4_4_ = iVar27;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_05);
                    a_05[1] = (longlong)ptr_00;
                    a_05[0] = in_stack_fffffffffffffd40;
                    a_05[2] = size;
                    a_05[3] = (longlong)ptr_03;
                    b_06[1] = (longlong)ptr_01;
                    b_06[0] = (longlong)ptr;
                    b_06[2]._0_4_ = in_stack_fffffffffffffd70;
                    b_06[2]._4_4_ = iVar10;
                    b_06[3]._0_4_ = uVar22;
                    b_06[3]._4_4_ = iVar27;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_06);
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar18) = auVar37;
                    auVar39 = vpcmpgtq_avx2(auVar37,local_1c0);
                    local_1c0 = vblendvpd_avx(auVar37,local_1c0,auVar39);
                    a_06[1] = (longlong)ptr_00;
                    a_06[0] = in_stack_fffffffffffffd40;
                    a_06[2] = size;
                    a_06[3] = (longlong)ptr_03;
                    b_07[1] = (longlong)ptr_01;
                    b_07[0] = (longlong)ptr;
                    b_07[2]._0_4_ = in_stack_fffffffffffffd70;
                    b_07[2]._4_4_ = iVar10;
                    b_07[3]._0_4_ = uVar22;
                    b_07[3]._4_4_ = iVar27;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_07);
                    local_240 = auVar37;
                  }
                  alVar6 = ptr_02[uVar5];
                  for (iVar29 = 0; iVar29 < iVar27; iVar29 = iVar29 + 1) {
                    auVar39 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8);
                    alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar39,8);
                  }
                  ((ppVar12->field_4).rowcols)->score_row[uVar13] = (int)alVar6[3];
                  uVar13 = uVar13 + 1;
                  sVar40 = size;
                }
                for (lVar17 = 0; size * 4 != lVar17; lVar17 = lVar17 + 4) {
                  piVar4 = ((ppVar12->field_4).rowcols)->score_col;
                  lVar7 = (*ptr_02 + lVar17)[1];
                  lVar8 = (*ptr_02)[lVar17 + 2];
                  lVar9 = (*ptr_02 + lVar17 + 2)[1];
                  *(int *)((long)piVar4 + lVar17) = (int)(*ptr_02)[lVar17];
                  *(int *)((long)piVar4 + size * 4 + lVar17) = (int)lVar7;
                  *(int *)((long)piVar4 + size * 8 + lVar17) = (int)lVar8;
                  *(int *)((long)piVar4 + size * 0xc + lVar17) = (int)lVar9;
                }
                alVar6 = ptr_02[uVar5];
                for (iVar29 = 0; iVar29 < iVar27; iVar29 = iVar29 + 1) {
                  auVar34 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,8);
                  alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar34,8);
                }
                auVar36._8_8_ = uVar23;
                auVar36._0_8_ = uVar23;
                auVar36._16_8_ = uVar23;
                auVar36._24_8_ = uVar23;
                auVar34 = vpcmpgtq_avx2(auVar36,local_1c0);
                auVar37._8_8_ = uStack_1d8;
                auVar37._0_8_ = local_1e0;
                auVar37._16_8_ = uStack_1d0;
                auVar37._24_8_ = uStack_1c8;
                auVar35._8_8_ = lVar20;
                auVar35._0_8_ = lVar20;
                auVar35._16_8_ = lVar20;
                auVar35._24_8_ = lVar20;
                auVar32 = vpcmpgtq_avx2(auVar37,auVar35);
                auVar34 = vpor_avx2(auVar32,auVar34);
                if ((((auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     SUB321(auVar34 >> 0x7f,0) == '\0') && SUB321(auVar34 >> 0xbf,0) == '\0') &&
                    -1 < auVar34[0x1f]) {
                  uVar14 = vpextrq_avx(alVar6._16_16_,1);
                  iVar29 = (int)uVar14;
                }
                else {
                  *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                  iVar29 = 0;
                  iVar10 = 0;
                  uVar22 = 0;
                }
                ppVar12->score = iVar29;
                ppVar12->end_query = uVar22;
                ppVar12->end_ref = iVar10;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar12;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_rowcol_scan_profile_avx2_256_64",pcVar19);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}